

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
 pybind11::detail::all_type_info_get_cache(PyTypeObject *type)

{
  undefined1 auVar1 [12];
  internals *piVar2;
  PyObject *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar3;
  handle local_58;
  handle local_50;
  _Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
  local_48;
  type local_28;
  
  local_50.m_ptr = in_RDI;
  piVar2 = get_internals();
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVar3 = std::
          _Hashtable<_typeobject*,std::pair<_typeobject*const,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>,std::allocator<std::pair<_typeobject*const,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>>,std::__detail::_Select1st,std::equal_to<_typeobject*>,std::hash<_typeobject*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<_typeobject*&,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>
                    ((_Hashtable<_typeobject*,std::pair<_typeobject*const,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>,std::allocator<std::pair<_typeobject*const,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>>,std::__detail::_Select1st,std::equal_to<_typeobject*>,std::hash<_typeobject*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&piVar2->registered_types_py,&local_50);
  std::_Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
  ~_Vector_base(&local_48);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_28.type = (PyTypeObject *)local_50.m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::all_type_info_get_cache(_typeobject*)::_lambda(pybind11::handle)_1_,,void>
              ((cpp_function *)&local_58,&local_28);
    weakref::weakref((weakref *)&local_48,local_50,local_58);
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    object::~object((object *)&local_48);
    object::~object((object *)&local_58);
  }
  auVar1 = pVar3._0_12_;
  pVar3._12_4_ = 0;
  pVar3.first.
  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
               )auVar1._0_8_;
  pVar3.second = (bool)auVar1[8];
  pVar3._9_3_ = auVar1._9_3_;
  return pVar3;
}

Assistant:

inline std::pair<decltype(internals::registered_types_py)::iterator, bool> all_type_info_get_cache(PyTypeObject *type) {
    auto res = get_internals().registered_types_py
#ifdef z__cpp_lib_unordered_map_try_emplace
        .try_emplace(type);
#else
        .emplace(type, std::vector<detail::type_info *>());
#endif
    if (res.second) {
        // New cache entry created; set up a weak reference to automatically remove it if the type
        // gets destroyed:
        weakref((PyObject *) type, cpp_function([type](handle wr) {
            get_internals().registered_types_py.erase(type);
            wr.dec_ref();
        })).release();
    }

    return res;
}